

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

Value * duckdb::ScalarFunctionExtractor::GetReturnType
                  (Value *__return_storage_ptr__,ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  string local_150;
  ScalarFunction local_130;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&local_130,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  LogicalType::ToString_abi_cxx11_(&local_150,&local_130.super_BaseScalarFunction.return_type);
  Value::Value(__return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_130.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024398b0;
  if (local_130.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_130.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_130.function.super__Function_base._M_manager)
              ((_Any_data *)&local_130.function,(_Any_data *)&local_130.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_130.super_BaseScalarFunction);
  return __return_storage_ptr__;
}

Assistant:

static Value GetReturnType(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		return Value(entry.functions.GetFunctionByOffset(offset).return_type.ToString());
	}